

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLValidityCodes.hpp
# Opt level: O0

ErrTypes xercesc_4_0::XMLValid::errorType(Codes toCheck)

{
  undefined4 local_c;
  Codes toCheck_local;
  
  if (((int)toCheck < 0x50) || (0x51 < (int)toCheck)) {
    if (((int)toCheck < 0x52) || (0x53 < (int)toCheck)) {
      if (((int)toCheck < 1) || (0x4f < (int)toCheck)) {
        local_c = ErrTypes_Unknown;
      }
      else {
        local_c = ErrType_Error;
      }
    }
    else {
      local_c = ErrType_Fatal;
    }
  }
  else {
    local_c = ErrType_Warning;
  }
  return local_c;
}

Assistant:

static XMLErrorReporter::ErrTypes errorType(const XMLValid::Codes toCheck)
    {
       if ((toCheck >= W_LowBounds) && (toCheck <= W_HighBounds))
           return XMLErrorReporter::ErrType_Warning;
       else if ((toCheck >= F_LowBounds) && (toCheck <= F_HighBounds))
            return XMLErrorReporter::ErrType_Fatal;
       else if ((toCheck >= E_LowBounds) && (toCheck <= E_HighBounds))
            return XMLErrorReporter::ErrType_Error;
       return XMLErrorReporter::ErrTypes_Unknown;
    }